

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

void __thiscall
duckdb::TemporaryFileManager::WriteTemporaryBuffer
          (TemporaryFileManager *this,block_id_t block_id,FileBuffer *buffer)

{
  _Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false> this_00;
  FileBuffer *buffer_00;
  idx_t iVar1;
  int64_t iVar2;
  TemporaryBufferSize size_p;
  mapped_type *pmVar3;
  pointer this_01;
  mapped_type *this_02;
  TemporaryFileHandle *this_03;
  mapped_type *pmVar4;
  TemporaryFileCompressionAdaptivity *pTVar5;
  __node_base *p_Var6;
  CompressionResult CVar7;
  TemporaryFileIndex index;
  idx_t index_1;
  TemporaryFileManagerLock lock;
  CompressionResult compression_result;
  AllocatedData compressed_buffer;
  TemporaryFileIdentifier identifier;
  _Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false> local_d0;
  TemporaryFileIndex local_c8;
  TemporaryFileIndex local_a8;
  lock_guard<std::mutex> local_90;
  TemporaryBufferSize local_88;
  TemporaryCompressionLevel local_80;
  int64_t local_78;
  TemporaryFileCompressionAdaptivity *local_70;
  FileBuffer *local_68;
  block_id_t local_60;
  AllocatedData local_58;
  TemporaryFileIdentifier local_40;
  
  local_60 = block_id;
  iVar1 = TaskScheduler::GetEstimatedCPUId();
  pTVar5 = (this->compression_adaptivities)._M_elems + ((uint)iVar1 & 0x3f);
  iVar2 = ::std::chrono::_V2::system_clock::now();
  AllocatedData::AllocatedData(&local_58);
  CVar7 = CompressBuffer(this,pTVar5,buffer,&local_58);
  size_p = CVar7.size;
  local_80 = CVar7.level;
  local_88 = size_p;
  TemporaryFileIndex::TemporaryFileIndex(&local_c8);
  TemporaryFileManagerLock::TemporaryFileManagerLock
            ((TemporaryFileManagerLock *)&local_90,&this->manager_lock);
  local_a8.identifier.size = size_p;
  local_78 = iVar2;
  local_70 = pTVar5;
  local_68 = buffer;
  pmVar3 = ::std::__detail::
           _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->files).files,(key_type *)&local_a8);
  p_Var6 = &(pmVar3->_M_h)._M_before_begin;
  do {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) goto LAB_017c8551;
    this_01 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
              ::operator->((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                            *)(p_Var6 + 2));
    TemporaryFileHandle::TryGetBlockIndex(&local_a8,this_01);
    local_c8.block_index.index = local_a8.block_index.index;
    local_c8.identifier.size = local_a8.identifier.size;
    local_c8.identifier.file_index.index = local_a8.identifier.file_index.index;
  } while (((local_a8.identifier.size == INVALID) ||
           (local_a8.identifier.file_index.index == 0xffffffffffffffff)) ||
          (local_a8.block_index.index == 0xffffffffffffffff));
  local_d0._M_head_impl =
       (((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
          *)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)->_M_t).
       super___uniq_ptr_impl<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TemporaryFileHandle_*,_std::default_delete<duckdb::TemporaryFileHandle>_>
       .super__Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false>._M_head_impl;
  if (local_d0._M_head_impl == (TemporaryFileHandle *)0x0) {
LAB_017c8551:
    this_02 = ::std::__detail::
              _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->index_managers,&local_88);
    local_a8.identifier.size = BlockIndexManager::GetNewBlockIndexInternal(this_02,local_88);
    ::std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&this_02->indexes_in_use,(unsigned_long *)&local_a8);
    TemporaryFileIdentifier::TemporaryFileIdentifier(&local_40,size_p,local_a8.identifier.size);
    this_03 = TemporaryFileMap::CreateFile(&this->files,&local_40);
    TemporaryFileHandle::TryGetBlockIndex(&local_a8,this_03);
    local_c8.block_index.index = local_a8.block_index.index;
    local_c8.identifier.file_index.index = local_a8.identifier.file_index.index;
    local_d0._M_head_impl = this_03;
  }
  local_c8.identifier.size = local_a8.identifier.size;
  pmVar4 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->used_blocks,&local_60);
  (pmVar4->block_index).index = local_c8.block_index.index;
  (pmVar4->identifier).size = local_c8.identifier.size;
  (pmVar4->identifier).file_index.index = local_c8.identifier.file_index.index;
  pthread_mutex_unlock((pthread_mutex_t *)local_90._M_device);
  optional_ptr<duckdb::TemporaryFileHandle,_true>::CheckValid
            ((optional_ptr<duckdb::TemporaryFileHandle,_true> *)&local_d0);
  buffer_00 = local_68;
  pTVar5 = local_70;
  iVar2 = local_78;
  this_00._M_head_impl = local_d0._M_head_impl;
  iVar1 = optional_idx::GetIndex(&local_c8.block_index);
  TemporaryFileHandle::WriteTemporaryBuffer(this_00._M_head_impl,buffer_00,iVar1,&local_58);
  TemporaryFileCompressionAdaptivity::Update(pTVar5,local_80,iVar2);
  AllocatedData::~AllocatedData(&local_58);
  return;
}

Assistant:

void TemporaryFileManager::WriteTemporaryBuffer(block_id_t block_id, FileBuffer &buffer) {
	// We group DEFAULT_BLOCK_ALLOC_SIZE blocks into the same file.
	D_ASSERT(buffer.AllocSize() == BufferManager::GetBufferManager(db).GetBlockAllocSize());

	const auto adaptivity_idx = TaskScheduler::GetEstimatedCPUId() % COMPRESSION_ADAPTIVITIES;
	auto &compression_adaptivity = compression_adaptivities[adaptivity_idx];

	const auto time_before_ns = TemporaryFileCompressionAdaptivity::GetCurrentTimeNanos();
	AllocatedData compressed_buffer;
	const auto compression_result = CompressBuffer(compression_adaptivity, buffer, compressed_buffer);

	TemporaryFileIndex index;
	optional_ptr<TemporaryFileHandle> handle;
	{
		TemporaryFileManagerLock lock(manager_lock);
		// first check if we can write to an open existing file
		for (auto &entry : files.GetMapForSize(compression_result.size)) {
			auto &temp_file = entry.second;
			index = temp_file->TryGetBlockIndex();
			if (index.IsValid()) {
				handle = entry.second.get();
				break;
			}
		}
		if (!handle) {
			// no existing handle to write to; we need to create & open a new file
			auto &size = compression_result.size;
			const TemporaryFileIdentifier identifier(size, index_managers[size].GetNewBlockIndex(size));
			auto &new_file = files.CreateFile(identifier);
			index = new_file.TryGetBlockIndex();
			handle = &new_file;
		}
		D_ASSERT(used_blocks.find(block_id) == used_blocks.end());
		used_blocks[block_id] = index;
	}
	D_ASSERT(handle);
	D_ASSERT(index.IsValid());

	handle->WriteTemporaryBuffer(buffer, index.block_index.GetIndex(), compressed_buffer);

	compression_adaptivity.Update(compression_result.level, time_before_ns);
}